

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O1

bool __thiscall nvim::Nvim::buf_is_loaded(Nvim *this,Buffer buffer)

{
  bool res;
  bool local_49;
  string local_48;
  Buffer local_28;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  local_28 = buffer;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"nvim_buf_is_loaded","");
  NvimRPC::call<bool,long>(&this->client_,&local_48,&local_49,&local_28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return local_49;
}

Assistant:

bool Nvim::buf_is_loaded(Buffer buffer) {
    bool res;
    client_.call("nvim_buf_is_loaded", res, buffer);
    return res;
}